

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_asn1.cc
# Opt level: O1

DH * DH_parse_parameters(CBS *cbs)

{
  int iVar1;
  DH *dh;
  DH *pDVar2;
  int line;
  CBS child;
  uint64_t priv_length;
  CBS CStack_28;
  ulong local_18;
  
  dh = DH_new();
  pDVar2 = dh;
  if (dh == (DH *)0x0) {
    dh = (DH *)0x0;
    goto LAB_0048009d;
  }
  iVar1 = CBS_get_asn1(cbs,&CStack_28,0x20000010);
  if (((iVar1 == 0) || (iVar1 = parse_integer(&CStack_28,(BIGNUM **)dh), iVar1 == 0)) ||
     (iVar1 = parse_integer(&CStack_28,(BIGNUM **)&dh->p), iVar1 == 0)) {
    ERR_put_error(5,0,0x68,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_asn1.cc"
                  ,0x38);
    dh = (DH *)0x0;
    goto LAB_0048009d;
  }
  if (CStack_28.len == 0) {
LAB_00480044:
    line = 0x47;
    if (CStack_28.len == 0) {
      iVar1 = dh_check_params_fast((DH *)dh);
      if (iVar1 != 0) {
        pDVar2 = (DH *)0x0;
        goto LAB_0048009d;
      }
      line = 0x4c;
    }
  }
  else {
    iVar1 = CBS_get_asn1_uint64(&CStack_28,&local_18);
    line = 0x40;
    if (local_18 >> 0x20 == 0 && iVar1 != 0) {
      *(int *)&dh->priv_key = (int)local_18;
      goto LAB_00480044;
    }
  }
  ERR_put_error(5,0,0x68,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_asn1.cc"
                ,line);
  dh = (DH *)0x0;
LAB_0048009d:
  if (pDVar2 != (DH *)0x0) {
    DH_free(pDVar2);
  }
  return (DH *)dh;
}

Assistant:

DH *DH_parse_parameters(CBS *cbs) {
  bssl::UniquePtr<DH> ret(DH_new());
  if (ret == nullptr) {
    return nullptr;
  }

  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !parse_integer(&child, &ret->p) ||
      !parse_integer(&child, &ret->g)) {
    OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
    return nullptr;
  }

  uint64_t priv_length;
  if (CBS_len(&child) != 0) {
    if (!CBS_get_asn1_uint64(&child, &priv_length) ||
        priv_length > UINT_MAX) {
      OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
      return nullptr;
    }
    ret->priv_length = (unsigned)priv_length;
  }

  if (CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
    return nullptr;
  }

  if (!dh_check_params_fast(ret.get())) {
    OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
    return nullptr;
  }

  return ret.release();
}